

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O2

void ggml_gallocr_allocate_node(ggml_gallocr_t galloc,ggml_tensor *node,int buffer_id)

{
  ggml_op gVar1;
  ggml_tensor *t;
  ggml_tensor *t_00;
  ggml_dyn_tallocr *pgVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  hash_node *phVar7;
  hash_node *phVar8;
  long lVar9;
  hash_node *phVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  free_block *pfVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t *psVar20;
  ulong uVar21;
  
  if (buffer_id < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-alloc.c"
               ,0x1df,"GGML_ASSERT(%s) failed","buffer_id >= 0");
  }
  phVar7 = ggml_gallocr_hash_get(galloc,node);
  if (((node->data == (void *)0x0) &&
      (phVar8 = ggml_gallocr_hash_get(galloc,node), phVar8->allocated == false)) &&
     (node->view_src == (ggml_tensor *)0x0)) {
    phVar7->allocated = true;
    gVar1 = node->op;
    if ((((ulong)gVar1 < 0x2f) && ((0x7e0041a007ecU >> ((ulong)gVar1 & 0x3f) & 1) != 0)) ||
       (gVar1 == GGML_OP_UNARY)) {
      for (lVar15 = 0; lVar15 != 10; lVar15 = lVar15 + 1) {
        t = node->src[lVar15];
        if (((t != (ggml_tensor *)0x0) &&
            (phVar8 = ggml_gallocr_hash_get(galloc,t), phVar8->allocated == true)) &&
           (((t->flags & 2) == 0 &&
            (((t->view_src == (ggml_tensor *)0x0 || ((t->view_src->flags & 2) == 0)) &&
             (node->type == t->type)))))) {
          lVar9 = 6;
          while (lVar9 != 10) {
            if ((node->ne[lVar9 + -6] != t->ne[lVar9 + -6]) ||
               (lVar5 = lVar9 + -2, lVar6 = lVar9 + -2, lVar9 = lVar9 + 1,
               node->ne[lVar5] != t->ne[lVar6])) goto LAB_0012a035;
          }
          phVar8 = ggml_gallocr_hash_get(galloc,t);
          if ((phVar8->n_children == 1) && (phVar8->n_views == 0)) {
            t_00 = t->view_src;
            if (t_00 == (ggml_tensor *)0x0) {
              phVar7->buffer_id = phVar8->buffer_id;
              phVar7->offset = phVar8->offset;
              phVar8->allocated = false;
              return;
            }
            phVar10 = ggml_gallocr_hash_get(galloc,t_00);
            if (((phVar10->n_views == 1) && (phVar10->n_children == 0)) && (t_00->data == t->data))
            {
              phVar7->buffer_id = phVar8->buffer_id;
              phVar7->offset = phVar8->offset;
              phVar8->allocated = false;
              phVar10->allocated = false;
              return;
            }
          }
        }
LAB_0012a035:
      }
    }
    pgVar2 = galloc->buf_tallocs[(uint)buffer_id];
    sVar11 = ggml_backend_buft_get_alloc_size(galloc->bufts[(uint)buffer_id],node);
    uVar12 = pgVar2->alignment;
    uVar17 = 0;
    uVar13 = (uVar12 - sVar11 % uVar12) % uVar12 + sVar11;
    uVar12 = (long)pgVar2->n_free_blocks - 1;
    uVar19 = 0;
    if (0 < (int)uVar12) {
      uVar19 = uVar12 & 0xffffffff;
    }
    psVar20 = &pgVar2->free_blocks[0].size;
    uVar18 = 0xffffffffffffffff;
    uVar21 = 0xffffffffffffffff;
    uVar16 = 0;
    for (; uVar19 != uVar17; uVar17 = uVar17 + 1) {
      uVar3 = *psVar20;
      if (uVar16 <= uVar3) {
        uVar16 = uVar3;
      }
      if (uVar3 <= uVar21 && uVar13 <= uVar3) {
        uVar18 = uVar17;
        uVar21 = uVar3;
      }
      uVar18 = uVar18 & 0xffffffff;
      psVar20 = psVar20 + 2;
    }
    if ((int)uVar18 == -1) {
      uVar17 = pgVar2->free_blocks[(long)pgVar2->n_free_blocks + -1].size;
      uVar19 = uVar12;
      if (uVar17 < uVar13) {
        if (uVar17 < uVar16) {
          uVar17 = uVar16;
        }
        ggml_log_internal(GGML_LOG_LEVEL_ERROR,
                          "%s: not enough space in the buffer to allocate %zu bytes, largest block available %zu bytes\n"
                          ,"ggml_dyn_tallocr_alloc",uVar13,uVar17);
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-alloc.c"
                   ,0xb6,"not enough space in the buffer");
      }
    }
    else {
      uVar19 = (long)(int)uVar18;
    }
    sVar11 = pgVar2->free_blocks[uVar19].offset;
    uVar17 = sVar11 + uVar13;
    pgVar2->free_blocks[uVar19].offset = uVar17;
    psVar20 = &pgVar2->free_blocks[uVar19].size;
    *psVar20 = *psVar20 - uVar13;
    if (*psVar20 == 0) {
      pgVar2->n_free_blocks = (int)uVar12;
      pfVar14 = pgVar2->free_blocks + uVar19 + 1;
      for (; (long)uVar19 < (long)(int)uVar12; uVar19 = uVar19 + 1) {
        sVar4 = pfVar14->size;
        ((ggml_dyn_tallocr *)(pfVar14 + -1))->alignment = pfVar14->offset;
        *(size_t *)&((ggml_dyn_tallocr *)(pfVar14 + -1))->n_free_blocks = sVar4;
        uVar12 = (ulong)(uint)pgVar2->n_free_blocks;
        pfVar14 = pfVar14 + 1;
      }
    }
    if (uVar17 < pgVar2->max_size) {
      uVar17 = pgVar2->max_size;
    }
    pgVar2->max_size = uVar17;
    phVar7->buffer_id = buffer_id;
    phVar7->offset = sVar11;
  }
  return;
}

Assistant:

static void ggml_gallocr_allocate_node(ggml_gallocr_t galloc, struct ggml_tensor * node, int buffer_id) {
    GGML_ASSERT(buffer_id >= 0);
    struct hash_node * hn = ggml_gallocr_hash_get(galloc, node);

    if (!ggml_gallocr_is_allocated(galloc, node) && !ggml_is_view(node)) {
        hn->allocated = true;
        assert(hn->offset == 0);

        // try to reuse a parent's buffer (inplace)
        if (ggml_op_can_inplace(node->op)) {
            for (int i = 0; i < GGML_MAX_SRC; i++) {
                struct ggml_tensor * parent = node->src[i];
                if (parent == NULL) {
                    continue;
                }

                // if the node's data is external, then we cannot re-use it
                if (!ggml_gallocr_is_own(galloc, parent)) {
                    AT_PRINTF("not reusing parent %s for %s as %p is external\n", parent->name, node->name, parent->data);
                    continue;
                }

                // outputs cannot be reused
                if (parent->flags & GGML_TENSOR_FLAG_OUTPUT || (parent->view_src != NULL && parent->view_src->flags & GGML_TENSOR_FLAG_OUTPUT)) {
                    AT_PRINTF("not reusing parent %s for %s as it is an output\n", parent->name, node->name);
                    continue;
                }

                if (!ggml_are_same_layout(node, parent)) {
                    AT_PRINTF("not reusing parent %s for %s as layouts are different\n", parent->name, node->name);
                    continue;
                }

                struct hash_node * p_hn = ggml_gallocr_hash_get(galloc, parent);
                if (p_hn->n_children == 1 && p_hn->n_views == 0) {
                    if (ggml_is_view(parent)) {
                        struct ggml_tensor * view_src = parent->view_src;
                        struct hash_node * view_src_hn = ggml_gallocr_hash_get(galloc, view_src);
                        if (view_src_hn->n_views == 1 && view_src_hn->n_children == 0 && view_src->data == parent->data) {
                            AT_PRINTF("reusing view parent %s (%s) for %s\n", parent->name, view_src->name, node->name);
                            assert(view_src_hn->offset == p_hn->offset);
                            hn->buffer_id = p_hn->buffer_id;
                            hn->offset = p_hn->offset;
                            p_hn->allocated = false; // avoid freeing the parent
                            view_src_hn->allocated = false;
                            return;
                        }
                    } else {
                        AT_PRINTF("reusing parent %s for %s\n", parent->name, node->name);
                        hn->buffer_id = p_hn->buffer_id;
                        hn->offset = p_hn->offset;
                        p_hn->allocated = false; // avoid freeing the parent
                        return;
                    }
                }
            }
        }
        // allocate tensor from the buffer
        struct ggml_dyn_tallocr * alloc = galloc->buf_tallocs[buffer_id];
        ggml_backend_buffer_type_t buft = galloc->bufts[buffer_id];
        size_t size = ggml_backend_buft_get_alloc_size(buft, node);
        size_t offset = ggml_dyn_tallocr_alloc(alloc, size, node);
        hn->buffer_id = buffer_id;
        hn->offset = offset;
    }
}